

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::prepareDescriptors
          (ImageLoadStoreTestInstance *this)

{
  int *piVar1;
  deInt32 *pdVar2;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar3;
  uint numDescriptors;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  pointer pSVar4;
  long *plVar5;
  pointer pSVar6;
  SharedPtrStateBase *pSVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  ImageType imageType;
  VkImageViewType VVar8;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetLayoutBuilder *pDVar9;
  DescriptorPoolBuilder *pDVar10;
  deUint64 *pdVar11;
  long *plVar12;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar13;
  SharedPtrStateBase *pSVar14;
  Unique<vk::Handle<(vk::HandleType)13>_> *pUVar15;
  undefined4 uVar16;
  ulong uVar17;
  long lVar18;
  Move<vk::Handle<(vk::HandleType)19>_> local_1e8;
  Move<vk::Handle<(vk::HandleType)21>_> local_1c8;
  Move<vk::Handle<(vk::HandleType)22>_> local_1a8;
  Move<vk::Handle<(vk::HandleType)22>_> local_188;
  Move<vk::Handle<(vk::HandleType)13>_> local_168;
  Move<vk::Handle<(vk::HandleType)13>_> local_148;
  Move<vk::Handle<(vk::HandleType)13>_> local_128;
  Move<vk::Handle<(vk::HandleType)13>_> local_108;
  Move<vk::Handle<(vk::HandleType)19>_> *local_e8;
  ulong local_e0;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  DescriptorSetLayoutBuilder local_a8;
  undefined8 local_60;
  undefined8 uStack_58;
  uint local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  numDescriptors = (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_a8);
  pDVar9 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (&local_a8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  pDVar9 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar9,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_1e8,pDVar9,vk,device,0);
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
  }
  pMVar3 = &this->m_descriptorSetLayout;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface =
       local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  if (local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  }
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_a8.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_1e8);
  pDVar10 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_1e8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       numDescriptors);
  pDVar10 = ::vk::DescriptorPoolBuilder::addType
                      (pDVar10,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
  ::vk::DescriptorPoolBuilder::build(&local_1c8,pDVar10,vk,device,1,numDescriptors);
  local_a8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  local_a8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_a8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_a8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                m_deviceIface;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_a8.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_a8.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (deUint64)
       local_a8.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_a8.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
               (VkDescriptorPool)
               local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
  }
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_e8 = pMVar3;
  if ((void *)local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_1e8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                    m_internal);
  }
  if ((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_singleLayerBind == true) {
    if (0 < (int)numDescriptors) {
      lVar18 = 8;
      uVar17 = 0;
      local_e0 = (ulong)numDescriptors;
      do {
        imageType = getImageTypeForSingleLayer
                              ((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.
                               m_type);
        VVar8 = mapImageViewType(imageType);
        makeDescriptorSet(&local_188,vk,device,
                          (VkDescriptorPool)
                          (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.
                          m_data.object.m_internal,
                          (VkDescriptorSetLayout)
                          (this->m_descriptorSetLayout).
                          super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
        pdVar11 = (deUint64 *)operator_new(0x20);
        pdVar11[2] = (deUint64)
                     local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device;
        pdVar11[3] = local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                     m_internal;
        *pdVar11 = local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        ;
        pdVar11[1] = (deUint64)
                     local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        plVar12 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar12 + 1) = 0;
        *(undefined4 *)((long)plVar12 + 0xc) = 0;
        *plVar12 = (long)&PTR__SharedPtrState_00d1e1d0;
        plVar12[2] = (long)pdVar11;
        *(undefined4 *)(plVar12 + 1) = 1;
        *(undefined4 *)((long)plVar12 + 0xc) = 1;
        pSVar4 = (this->m_allDescriptorSets).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar5 = *(long **)((long)&pSVar4->m_ptr + lVar18);
        if (plVar5 != plVar12) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)((long)pSVar4 + lVar18 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar4->m_ptr + lVar18) + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar18) + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              plVar5 = *(long **)((long)&pSVar4->m_ptr + lVar18);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&pSVar4->m_ptr + lVar18) = 0;
            }
          }
          *(deUint64 **)((long)pSVar4 + lVar18 + -8) = pdVar11;
          *(long **)((long)&pSVar4->m_ptr + lVar18) = plVar12;
          LOCK();
          *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
          UNLOCK();
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar4->m_ptr + lVar18) + 0xc);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        LOCK();
        plVar5 = plVar12 + 1;
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar12 + 0x10))(plVar12);
        }
        LOCK();
        piVar1 = (int *)((long)plVar12 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)(*plVar12 + 8))(plVar12);
        }
        if ((pointer)local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal != (pointer)0x0) {
          local_a8.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                        m_internal;
          (*(local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)
            ->_vptr_DeviceInterface[0x3d])
                    (local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_deviceIface,
                     local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                     m_device,local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                              deleter.m_pool.m_internal,1,&local_a8);
        }
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
             0;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
        local_188.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_c0 = 1;
        uStack_b8 = 1;
        uVar16 = (undefined4)uVar17;
        local_b0 = 1;
        subresourceRange.baseArrayLayer = uVar16;
        subresourceRange.levelCount = 1;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.layerCount = 1;
        uStack_b4 = uVar16;
        makeImageView(&local_108,vk,device,
                      (VkImage)(((this->m_imageSrc).
                                 super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                 .m_data.ptr)->m_image).
                               super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                               m_internal,VVar8,
                      (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                      subresourceRange);
        pdVar11 = (deUint64 *)operator_new(0x20);
        pdVar11[2] = (deUint64)
                     local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_device;
        pdVar11[3] = (deUint64)
                     local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar11 = local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        ;
        pdVar11[1] = (deUint64)
                     local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        plVar12 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar12 + 1) = 0;
        *(undefined4 *)((long)plVar12 + 0xc) = 0;
        *plVar12 = (long)&PTR__SharedPtrState_00d1de90;
        plVar12[2] = (long)pdVar11;
        *(undefined4 *)(plVar12 + 1) = 1;
        *(undefined4 *)((long)plVar12 + 0xc) = 1;
        pSVar6 = (this->m_allSrcImageViews).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar5 = *(long **)((long)&pSVar6->m_ptr + lVar18);
        if (plVar5 != plVar12) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)((long)pSVar6 + lVar18 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar6->m_ptr + lVar18) + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(*(long *)((long)&pSVar6->m_ptr + lVar18) + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              plVar5 = *(long **)((long)&pSVar6->m_ptr + lVar18);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&pSVar6->m_ptr + lVar18) = 0;
            }
          }
          *(deUint64 **)((long)pSVar6 + lVar18 + -8) = pdVar11;
          *(long **)((long)&pSVar6->m_ptr + lVar18) = plVar12;
          LOCK();
          *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
          UNLOCK();
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar6->m_ptr + lVar18) + 0xc);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        LOCK();
        plVar5 = plVar12 + 1;
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar12 + 0x10))(plVar12);
        }
        LOCK();
        piVar1 = (int *)((long)plVar12 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)(*plVar12 + 8))(plVar12);
        }
        if (local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_d8 = 1;
        uStack_d0 = 1;
        local_c8 = 1;
        subresourceRange_00.baseArrayLayer = uVar16;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.layerCount = 1;
        uStack_cc = uVar16;
        makeImageView(&local_128,vk,device,
                      (VkImage)(((this->m_imageDst).
                                 super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                 .m_data.ptr)->m_image).
                               super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                               m_internal,VVar8,
                      (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                      subresourceRange_00);
        pdVar11 = (deUint64 *)operator_new(0x20);
        pdVar11[2] = (deUint64)
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_device;
        pdVar11[3] = (deUint64)
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_allocator;
        *pdVar11 = local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
        ;
        pdVar11[1] = (deUint64)
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                     m_deviceIface;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        plVar12 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar12 + 1) = 0;
        *(undefined4 *)((long)plVar12 + 0xc) = 0;
        *plVar12 = (long)&PTR__SharedPtrState_00d1de90;
        plVar12[2] = (long)pdVar11;
        *(undefined4 *)(plVar12 + 1) = 1;
        *(undefined4 *)((long)plVar12 + 0xc) = 1;
        pSVar6 = (this->m_allDstImageViews).
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar5 = *(long **)((long)&pSVar6->m_ptr + lVar18);
        if (plVar5 != plVar12) {
          if (plVar5 != (long *)0x0) {
            LOCK();
            plVar5 = plVar5 + 1;
            *(int *)plVar5 = (int)*plVar5 + -1;
            UNLOCK();
            if ((int)*plVar5 == 0) {
              *(undefined8 *)((long)pSVar6 + lVar18 + -8) = 0;
              (**(code **)(**(long **)((long)&pSVar6->m_ptr + lVar18) + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(*(long *)((long)&pSVar6->m_ptr + lVar18) + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              plVar5 = *(long **)((long)&pSVar6->m_ptr + lVar18);
              if (plVar5 != (long *)0x0) {
                (**(code **)(*plVar5 + 8))();
              }
              *(undefined8 *)((long)&pSVar6->m_ptr + lVar18) = 0;
            }
          }
          *(deUint64 **)((long)pSVar6 + lVar18 + -8) = pdVar11;
          *(long **)((long)&pSVar6->m_ptr + lVar18) = plVar12;
          LOCK();
          *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
          UNLOCK();
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar6->m_ptr + lVar18) + 0xc);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        LOCK();
        plVar5 = plVar12 + 1;
        *(int *)plVar5 = (int)*plVar5 + -1;
        UNLOCK();
        if ((int)*plVar5 == 0) {
          (**(code **)(*plVar12 + 0x10))(plVar12);
        }
        LOCK();
        piVar1 = (int *)((long)plVar12 + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)(*plVar12 + 8))(plVar12);
        }
        if (local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                     (VkImageView)
                     local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
                     m_internal);
        }
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
        local_128.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        uVar17 = uVar17 + 1;
        lVar18 = lVar18 + 0x10;
      } while (local_e0 != uVar17);
    }
  }
  else {
    VVar8 = mapImageViewType((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.
                             m_type);
    makeDescriptorSet(&local_1a8,vk,device,
                      (VkDescriptorPool)
                      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data
                      .object.m_internal,
                      (VkDescriptorSetLayout)
                      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                      m_data.object.m_internal);
    pUVar13 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    (pUVar13->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    (pUVar13->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
    *(deUint64 *)&(pUVar13->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (pUVar13->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    pSVar14 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar14->strongRefCount = 0;
    pSVar14->weakRefCount = 0;
    pSVar14->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1e1d0;
    pSVar14[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar13;
    pSVar14->strongRefCount = 1;
    pSVar14->weakRefCount = 1;
    pSVar4 = (this->m_allDescriptorSets).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = pSVar4->m_state;
    if (pSVar7 != pSVar14) {
      if (pSVar7 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar2 = &pSVar7->strongRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          pSVar4->m_ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
          (*pSVar4->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar2 = &pSVar4->m_state->weakRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          if (pSVar4->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar4->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar4->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar4->m_ptr = pUVar13;
      pSVar4->m_state = pSVar14;
      LOCK();
      pSVar14->strongRefCount = pSVar14->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar2 = &pSVar4->m_state->weakRefCount;
      *pdVar2 = *pdVar2 + 1;
      UNLOCK();
    }
    LOCK();
    pdVar2 = &pSVar14->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*pSVar14->_vptr_SharedPtrStateBase[2])(pSVar14);
    }
    LOCK();
    pdVar2 = &pSVar14->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*pSVar14->_vptr_SharedPtrStateBase[1])(pSVar14);
    }
    if ((pointer)local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
        != (pointer)0x0) {
      local_a8.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                    m_internal;
      (*(local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1);
    }
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal = 0;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    local_1a8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_48 = 1;
    uStack_40 = 1;
    subresourceRange_01.levelCount = 1;
    subresourceRange_01.baseArrayLayer = 0;
    subresourceRange_01.aspectMask = 1;
    subresourceRange_01.baseMipLevel = 0;
    subresourceRange_01.layerCount = numDescriptors;
    local_38 = numDescriptors;
    makeImageView(&local_148,vk,device,
                  (VkImage)(((this->m_imageSrc).
                             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                             .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,VVar8,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_01);
    pUVar15 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    *(deUint64 *)&(pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pSVar14 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar14->strongRefCount = 0;
    pSVar14->weakRefCount = 0;
    pSVar14->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1de90;
    pSVar14[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar15;
    pSVar14->strongRefCount = 1;
    pSVar14->weakRefCount = 1;
    pSVar6 = (this->m_allSrcImageViews).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = pSVar6->m_state;
    if (pSVar7 != pSVar14) {
      if (pSVar7 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar2 = &pSVar7->strongRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          pSVar6->m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
          (*pSVar6->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar2 = &pSVar6->m_state->weakRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          if (pSVar6->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar6->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar6->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar6->m_ptr = pUVar15;
      pSVar6->m_state = pSVar14;
      LOCK();
      pSVar14->strongRefCount = pSVar14->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar2 = &pSVar6->m_state->weakRefCount;
      *pdVar2 = *pdVar2 + 1;
      UNLOCK();
    }
    LOCK();
    pdVar2 = &pSVar14->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*pSVar14->_vptr_SharedPtrStateBase[2])(pSVar14);
    }
    LOCK();
    pdVar2 = &pSVar14->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*pSVar14->_vptr_SharedPtrStateBase[1])(pSVar14);
    }
    if (local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_60 = 1;
    uStack_58 = 1;
    subresourceRange_02.levelCount = 1;
    subresourceRange_02.baseArrayLayer = 0;
    subresourceRange_02.aspectMask = 1;
    subresourceRange_02.baseMipLevel = 0;
    subresourceRange_02.layerCount = numDescriptors;
    local_50 = numDescriptors;
    makeImageView(&local_168,vk,device,
                  (VkImage)(((this->m_imageDst).
                             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                             .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,VVar8,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_02);
    pUVar15 = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    (pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    *(deUint64 *)&(pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data =
         local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (pUVar15->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
    local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pSVar14 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar14->strongRefCount = 0;
    pSVar14->weakRefCount = 0;
    pSVar14->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1de90;
    pSVar14[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar15;
    pSVar14->strongRefCount = 1;
    pSVar14->weakRefCount = 1;
    pSVar6 = (this->m_allDstImageViews).
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar7 = pSVar6->m_state;
    if (pSVar7 != pSVar14) {
      if (pSVar7 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar2 = &pSVar7->strongRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          pSVar6->m_ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)0x0;
          (*pSVar6->m_state->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar2 = &pSVar6->m_state->weakRefCount;
        *pdVar2 = *pdVar2 + -1;
        UNLOCK();
        if (*pdVar2 == 0) {
          if (pSVar6->m_state != (SharedPtrStateBase *)0x0) {
            (*pSVar6->m_state->_vptr_SharedPtrStateBase[1])();
          }
          pSVar6->m_state = (SharedPtrStateBase *)0x0;
        }
      }
      pSVar6->m_ptr = pUVar15;
      pSVar6->m_state = pSVar14;
      LOCK();
      pSVar14->strongRefCount = pSVar14->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar2 = &pSVar6->m_state->weakRefCount;
      *pdVar2 = *pdVar2 + 1;
      UNLOCK();
    }
    LOCK();
    pdVar2 = &pSVar14->strongRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*pSVar14->_vptr_SharedPtrStateBase[2])(pSVar14);
    }
    LOCK();
    pdVar2 = &pSVar14->weakRefCount;
    *pdVar2 = *pdVar2 + -1;
    UNLOCK();
    if (*pdVar2 == 0) {
      (*pSVar14->_vptr_SharedPtrStateBase[1])(pSVar14);
    }
    if (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  return (VkDescriptorSetLayout)
         (local_e8->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout ImageLoadStoreTestInstance::prepareDescriptors (void)
{
	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			const VkImageViewType viewType = mapImageViewType(getImageTypeForSingleLayer(m_texture.type()));
			const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u);

			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allSrcImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
			m_allDstImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
		}
	}
	else // bind all layers at once
	{
		const VkImageViewType viewType = mapImageViewType(m_texture.type());
		const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers);

		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allSrcImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
		m_allDstImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}